

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O2

void ProcessSymbol(ImageSectionStream *imageSectionStream,Record *record,RVAToSymbolMap *toMap)

{
  SymbolRecordKind SVar1;
  ushort oneBasedSectionIndex;
  uint32_t offsetInSection;
  __hashtable *__h;
  PDBSymbol symbol;
  PDBSymbol local_90;
  undefined1 local_58 [64];
  
  local_90.name._M_dataplus._M_p = (pointer)&local_90.name.field_2;
  local_90.name._M_string_length = 0;
  local_90.name.field_2._M_local_buf[0] = '\0';
  local_90.rva = 0;
  local_90.length = 0;
  local_90.section = 0;
  local_90.offset = 0;
  local_90.typeIndex = 0;
  SVar1 = (record->header).kind;
  offsetInSection = 0;
  oneBasedSectionIndex = 0;
  switch(SVar1) {
  case S_LDATA32:
    std::__cxx11::string::assign((char *)&local_90);
    if (local_90.name._M_string_length == 0) {
      offsetInSection = local_90.offset;
      oneBasedSectionIndex = (uint16_t)local_90.section;
      goto switchD_00108b4f_caseD_1111;
    }
    break;
  case S_GDATA32:
    std::__cxx11::string::assign((char *)&local_90);
    break;
  case S_PUB32:
    offsetInSection = 0;
    oneBasedSectionIndex = 0;
    if (((record->data).S_ENVBLOCK.flags & 2) != 0) {
      std::__cxx11::string::assign((char *)&local_90);
      oneBasedSectionIndex = (record->data).S_PUB32.section;
      local_90.offset = (record->data).S_FRAMEPROC.cbPad;
      local_90.section = (uint)oneBasedSectionIndex;
      offsetInSection = local_90.offset;
    }
    goto switchD_00108b4f_caseD_1111;
  case S_LPROC32:
    std::__cxx11::string::assign((char *)&local_90);
    goto LAB_00108c54;
  case S_GPROC32:
    std::__cxx11::string::assign((char *)&local_90);
    goto LAB_00108c54;
  case S_REGREL32:
    goto switchD_00108b4f_caseD_1111;
  case S_LTHREAD32:
    std::__cxx11::string::assign((char *)&local_90);
    break;
  case S_GTHREAD32:
    std::__cxx11::string::assign((char *)&local_90);
    break;
  default:
    if (SVar1 == S_LPROC32_ID) {
      std::__cxx11::string::assign((char *)&local_90);
    }
    else {
      offsetInSection = 0;
      if (SVar1 != S_GPROC32_ID) goto switchD_00108b4f_caseD_1111;
      std::__cxx11::string::assign((char *)&local_90);
    }
LAB_00108c54:
    oneBasedSectionIndex = (record->data).S_LPROC32.section;
    local_90.offset = (record->data).S_LPROC32.offset;
    local_90.section = (uint)oneBasedSectionIndex;
    local_90.length = (record->data).S_FRAMEPROC.cbSaveRegs;
    offsetInSection = local_90.offset;
    goto switchD_00108b4f_caseD_1111;
  }
  oneBasedSectionIndex = (record->data).S_PUB32.section;
  local_90.offset = (record->data).S_FRAMEPROC.cbPad;
  local_90.section = (uint)oneBasedSectionIndex;
  local_90.typeIndex = (record->data).S_FRAMEPROC.cbFrame;
  offsetInSection = local_90.offset;
switchD_00108b4f_caseD_1111:
  local_90.rva = PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                           (imageSectionStream,oneBasedSectionIndex,offsetInSection);
  if (local_90.rva != 0) {
    std::pair<const_unsigned_int,_PDBSymbol>::pair<unsigned_int_&,_PDBSymbol_&,_true>
              ((pair<const_unsigned_int,_PDBSymbol> *)local_58,&local_90.rva,&local_90);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,PDBSymbol>,std::allocator<std::pair<unsigned_int_const,PDBSymbol>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,PDBSymbol>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,PDBSymbol>,std::allocator<std::pair<unsigned_int_const,PDBSymbol>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)toMap,local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

static void ProcessSymbol(const PDB::ImageSectionStream& imageSectionStream, const PDB::CodeView::DBI::Record* record, RVAToSymbolMap& toMap)
{
    PDBSymbol symbol;
    if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_PUB32)
    {
        if (PDB_AS_UNDERLYING(record->data.S_PUB32.flags) & PDB_AS_UNDERLYING(PDB::CodeView::DBI::PublicSymbolFlags::Function))
        {
            symbol.name = record->data.S_PUB32.name;
            symbol.section = record->data.S_PUB32.section;
            symbol.offset = record->data.S_PUB32.offset;
        }
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LPROC32)
    {
        symbol.name = record->data.S_LPROC32.name;
        symbol.section = record->data.S_LPROC32.section;
        symbol.offset = record->data.S_LPROC32.offset;
        symbol.length = record->data.S_LPROC32.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GPROC32)
    {
        symbol.name = record->data.S_GPROC32.name;
        symbol.section = record->data.S_GPROC32.section;
        symbol.offset = record->data.S_GPROC32.offset;
        symbol.length = record->data.S_GPROC32.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LPROC32_ID)
    {
        symbol.name = record->data.S_LPROC32_ID.name;
        symbol.section = record->data.S_LPROC32_ID.section;
        symbol.offset = record->data.S_LPROC32_ID.offset;
        symbol.length = record->data.S_LPROC32_ID.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GPROC32_ID)
    {
        symbol.name = record->data.S_GPROC32_ID.name;
        symbol.section = record->data.S_GPROC32_ID.section;
        symbol.offset = record->data.S_GPROC32_ID.offset;
        symbol.length = record->data.S_GPROC32_ID.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LDATA32)
    {
        symbol.name = record->data.S_LDATA32.name;
        // Often there are LDATA32 symbols without a name that are same size as function entries? Skip those.
        if (!symbol.name.empty())
        {
            symbol.section = record->data.S_LDATA32.section;
            symbol.offset = record->data.S_LDATA32.offset;
            symbol.typeIndex = record->data.S_LDATA32.typeIndex;
        }
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GDATA32)
    {
        symbol.name = record->data.S_GDATA32.name;
        symbol.section = record->data.S_GDATA32.section;
        symbol.offset = record->data.S_GDATA32.offset;
        symbol.typeIndex = record->data.S_GDATA32.typeIndex;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LTHREAD32)
    {
        symbol.name = record->data.S_LTHREAD32.name;
        symbol.section = record->data.S_LTHREAD32.section;
        symbol.offset = record->data.S_LTHREAD32.offset;
        symbol.typeIndex = record->data.S_LTHREAD32.typeIndex;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GTHREAD32)
    {
        symbol.name = record->data.S_GTHREAD32.name;
        symbol.section = record->data.S_GTHREAD32.section;
        symbol.offset = record->data.S_GTHREAD32.offset;
        symbol.typeIndex = record->data.S_GTHREAD32.typeIndex;
    }
    symbol.rva = imageSectionStream.ConvertSectionOffsetToRVA(symbol.section, symbol.offset);
    if (symbol.rva == 0u)
    {
        // certain symbols (e.g. control-flow guard symbols) don't have a valid RVA, ignore those
        return;
    }

    toMap.insert({ symbol.rva, symbol });
}